

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(ze_device_compute_properties_t val)

{
  ostream *poVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  undefined4 uVar8;
  uint uVar9;
  long lVar10;
  string *in_RDI;
  string __str_9;
  uint in_stack_00000020;
  uint in_stack_00000024;
  stringstream ss;
  uint in_stack_0000002c;
  uint in_stack_00000030;
  uint in_stack_00000034;
  uint in_stack_00000038;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  string *local_208;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  uint auStack_1d8 [22];
  ios_base local_180 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &in_RDI->field_2;
  (in_RDI->_M_dataplus)._M_p = (pointer)local_78;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_200,(ze_structure_type_t)__str_9._M_string_length);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)local_200);
  poVar1 = (ostream *)(local_200 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0x",2);
  lVar10 = *(long *)(CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) +
                    -0x18);
  *(uint *)((long)auStack_1d8 + lVar10) = *(uint *)((long)auStack_1d8 + lVar10) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
  std::ios_base::~ios_base(local_180);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < (uint)__str_9.field_2._8_4_) {
    uVar8 = __str_9.field_2._8_4_;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if ((uint)uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010551f;
      }
      if ((uint)uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010551f;
      }
      if ((uint)uVar8 < 10000) goto LAB_0010551f;
      bVar2 = 99999 < (uint)uVar8;
      uVar8 = (uint)uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010551f:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,__str_9.field_2._8_4_);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < (uint)__str_9.field_2._12_4_) {
    uVar8 = __str_9.field_2._12_4_;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if ((uint)uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001055e0;
      }
      if ((uint)uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001055e0;
      }
      if ((uint)uVar8 < 10000) goto LAB_001055e0;
      bVar2 = 99999 < (uint)uVar8;
      uVar8 = (uint)uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001055e0:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,__str_9.field_2._12_4_);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000020) {
    uVar9 = in_stack_00000020;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001056a1;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001056a1;
      }
      if (uVar9 < 10000) goto LAB_001056a1;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001056a1:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,in_stack_00000020);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000024) {
    uVar9 = in_stack_00000024;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00105762;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00105762;
      }
      if (uVar9 < 10000) goto LAB_00105762;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00105762:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,in_stack_00000024);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < _ss) {
    uVar9 = _ss;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00105823;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00105823;
      }
      if (uVar9 < 10000) goto LAB_00105823;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00105823:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_200._0_8_,local_200._8_4_,_ss);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000002c) {
    uVar9 = in_stack_0000002c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001058e4;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001058e4;
      }
      if (uVar9 < 10000) goto LAB_001058e4;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001058e4:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,in_stack_0000002c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000030) {
    uVar9 = in_stack_00000030;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001059a5;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001059a5;
      }
      if (uVar9 < 10000) goto LAB_001059a5;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001059a5:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,in_stack_00000030);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000034) {
    uVar9 = in_stack_00000034;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00105a66;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00105a66;
      }
      if (uVar9 < 10000) goto LAB_00105a66;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00105a66:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,in_stack_00000034);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000038) {
    uVar9 = in_stack_00000038;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00105b27;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00105b27;
      }
      if (uVar9 < 10000) goto LAB_00105b27;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00105b27:
  local_200._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_200,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_200._0_8_,local_200._8_4_,in_stack_00000038);
  std::__cxx11::string::_M_append((char *)in_RDI,local_200._0_8_);
  if ((ostream *)local_200._0_8_ != poVar1) {
    operator_delete((void *)local_200._0_8_,
                    CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  local_200._8_8_ = 0;
  local_1f0._M_local_buf[0] = '\0';
  lVar10 = 0x34;
  local_208 = in_RDI;
  local_200._0_8_ = poVar1;
  do {
    uVar9 = *(uint *)((long)((long)register0x00000020 + 8) + lVar10);
    cVar4 = '\x01';
    if (9 < uVar9) {
      uVar6 = uVar9;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar6 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00105c0f;
        }
        if (uVar6 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00105c0f;
        }
        if (uVar6 < 10000) goto LAB_00105c0f;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00105c0f:
    local_228 = &local_218;
    std::__cxx11::string::_M_construct((ulong)&local_228,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_228,(uint)local_220,uVar9);
    std::__cxx11::string::_M_append(local_200,(ulong)local_228);
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    std::__cxx11::string::append(local_200);
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x54) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_200);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10b420);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_218 = *plVar7;
        lStack_210 = plVar5[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *plVar7;
        local_228 = (long *)*plVar5;
      }
      local_220 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_208,(ulong)local_228);
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((ostream *)local_200._0_8_ != (ostream *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_,
                        CONCAT71(local_1f0._M_allocated_capacity._1_7_,local_1f0._M_local_buf[0]) +
                        1);
      }
      std::__cxx11::string::append((char *)local_208);
      return local_208;
    }
  } while( true );
}

Assistant:

std::string to_string( const ze_device_compute_properties_t val )
{
    std::string str;
    
    str += "stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "maxTotalGroupSize : ";
    str += std::to_string(val.maxTotalGroupSize);
    str += "\n";
    
    str += "maxGroupSizeX : ";
    str += std::to_string(val.maxGroupSizeX);
    str += "\n";
    
    str += "maxGroupSizeY : ";
    str += std::to_string(val.maxGroupSizeY);
    str += "\n";
    
    str += "maxGroupSizeZ : ";
    str += std::to_string(val.maxGroupSizeZ);
    str += "\n";
    
    str += "maxGroupCountX : ";
    str += std::to_string(val.maxGroupCountX);
    str += "\n";
    
    str += "maxGroupCountY : ";
    str += std::to_string(val.maxGroupCountY);
    str += "\n";
    
    str += "maxGroupCountZ : ";
    str += std::to_string(val.maxGroupCountZ);
    str += "\n";
    
    str += "maxSharedLocalMemory : ";
    str += std::to_string(val.maxSharedLocalMemory);
    str += "\n";
    
    str += "numSubGroupSizes : ";
    str += std::to_string(val.numSubGroupSizes);
    str += "\n";
    
    str += "subGroupSizes : ";
    {
        std::string tmp;
        for( auto& entry : val.subGroupSizes )
        {
            tmp += std::to_string( entry );
            tmp += ", ";
        }
        str += "[ " + tmp.substr( 0, tmp.size() - 2 ) + " ]";;
    }
    str += "\n";

    return str;
}